

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O0

FourCC __thiscall riffcpp::Chunk::type(Chunk *this)

{
  FourCC FVar1;
  element_type *peVar2;
  pointer pvVar3;
  fpos<__mbstate_t> fVar4;
  streamoff local_30;
  __mbstate_t local_28;
  streamoff offs;
  Chunk *this_local;
  FourCC read_type;
  
  peVar2 = std::
           __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->pimpl);
  fVar4 = std::fpos<__mbstate_t>::operator+(&this->pimpl->m_pos,8);
  local_30 = fVar4._M_off;
  local_28 = fVar4._M_state;
  std::istream::seekg(peVar2,local_30,local_28);
  peVar2 = std::
           __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->pimpl);
  pvVar3 = std::array<char,_4UL>::data((array<char,_4UL> *)((long)&this_local + 4));
  std::array<char,_4UL>::size((array<char,_4UL> *)((long)&this_local + 4));
  std::istream::read((char *)peVar2,(long)pvVar3);
  FVar1._M_elems[0] = this_local._4_1_;
  FVar1._M_elems[1] = this_local._5_1_;
  FVar1._M_elems[2] = this_local._6_1_;
  FVar1._M_elems[3] = this_local._7_1_;
  return (FourCC)FVar1._M_elems;
}

Assistant:

riffcpp::FourCC riffcpp::Chunk::type() {
  std::streamoff offs{8};
  pimpl->m_stream->seekg(pimpl->m_pos + offs);
  riffcpp::FourCC read_type;
  pimpl->m_stream->read(read_type.data(), read_type.size());
  return read_type;
}